

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O3

IOTHUB_MESSAGING_RESULT
IoTHubMessaging_LL_SetTrustedCert(IOTHUB_MESSAGING_HANDLE messagingHandle,char *trusted_cert)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_MESSAGING_RESULT IVar3;
  char *temp_cert;
  
  if (messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0 || trusted_cert == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar3 = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else {
      IVar3 = IOTHUB_MESSAGING_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_SetTrustedCert",0x621,1,
                "Invalid argument messagingHandle: %p trusted_cert: %p",messagingHandle,trusted_cert
               );
    }
  }
  else {
    temp_cert = (char *)0x0;
    iVar1 = mallocAndStrcpy_s(&temp_cert,trusted_cert);
    IVar3 = IOTHUB_MESSAGING_ERROR;
    if (iVar1 == 0) {
      if (messagingHandle->trusted_cert != (char *)0x0) {
        free(messagingHandle->trusted_cert);
      }
      messagingHandle->trusted_cert = temp_cert;
      IVar3 = IOTHUB_MESSAGING_OK;
    }
  }
  return IVar3;
}

Assistant:

IOTHUB_MESSAGING_RESULT IoTHubMessaging_LL_SetTrustedCert(IOTHUB_MESSAGING_HANDLE messagingHandle, const char* trusted_cert)
{
    IOTHUB_MESSAGING_RESULT result;

    if (messagingHandle == NULL || trusted_cert == NULL)
    {
        LogError("Invalid argument messagingHandle: %p trusted_cert: %p", messagingHandle, trusted_cert);
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else
    {
        char* temp_cert = NULL;
        if (mallocAndStrcpy_s(&temp_cert, trusted_cert) != 0)
        {
            result = IOTHUB_MESSAGING_ERROR;
        }
        else
        {
            if (messagingHandle->trusted_cert != NULL)
            {
                free(messagingHandle->trusted_cert);
            }
            messagingHandle->trusted_cert = temp_cert;
            result = IOTHUB_MESSAGING_OK;
        }
    }
    return result;
}